

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::GetColumnOffset(int column_index)

{
  ImGuiColumns *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumnData *pIVar3;
  int in_EDI;
  float x_offset;
  float t;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  int local_8;
  float local_4;
  
  pIVar2 = GetCurrentWindowRead();
  pIVar1 = (pIVar2->DC).CurrentColumns;
  if (pIVar1 == (ImGuiColumns *)0x0) {
    local_4 = 0.0;
  }
  else {
    local_8 = in_EDI;
    if (in_EDI < 0) {
      local_8 = pIVar1->Current;
    }
    pIVar3 = ImVector<ImGuiColumnData>::operator[](&pIVar1->Columns,local_8);
    local_4 = ImLerp<float>(pIVar1->OffMinX,pIVar1->OffMaxX,pIVar3->OffsetNorm);
  }
  return local_4;
}

Assistant:

float ImGui::GetColumnOffset(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return 0.0f;

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const float t = columns->Columns[column_index].OffsetNorm;
    const float x_offset = ImLerp(columns->OffMinX, columns->OffMaxX, t);
    return x_offset;
}